

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_dreturn(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *pFVar1;
  anon_union_8_10_52016fac_for_data extraout_RDX;
  Value operand;
  Value VVar2;
  
  this_00 = VMStack::getInstance();
  pFVar1 = VMStack::getTopFrame(this_00);
  operand = Frame::popTopOfOperandStack(pFVar1);
  if (operand.type != DOUBLE) {
    __assert_fail("returnValue.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xda2,"void ExecutionEngine::i_dreturn()");
  }
  VVar2 = Frame::popTopOfOperandStack(pFVar1);
  if ((VVar2._0_8_ & 0xffffffff00000000) == 0xa00000000) {
    VMStack::destroyTopFrame(this_00);
    pFVar1 = VMStack::getTopFrame(this_00);
    VVar2.data.longValue = extraout_RDX.longValue;
    VVar2.printType = BOOLEAN;
    VVar2.type = PADDING;
    Frame::pushIntoOperandStack(pFVar1,VVar2);
    Frame::pushIntoOperandStack(pFVar1,operand);
    return;
  }
  __assert_fail("topFrame->popTopOfOperandStack().type == ValueType::PADDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xda3,"void ExecutionEngine::i_dreturn()");
}

Assistant:

void ExecutionEngine::i_dreturn() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    Value returnValue = topFrame->popTopOfOperandStack();
    assert(returnValue.type == ValueType::DOUBLE);
    assert(topFrame->popTopOfOperandStack().type == ValueType::PADDING); // o debaixo precisa ser padding
    
    stackFrame.destroyTopFrame();
    
    Frame *newTopFrame = stackFrame.getTopFrame();
    
    Value padding;
    padding.type = ValueType::PADDING;
    newTopFrame->pushIntoOperandStack(padding);
    newTopFrame->pushIntoOperandStack(returnValue);
}